

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O0

void __thiscall
libnbt::NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::NBTTagData(NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this)

{
  NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  NBTBase::NBTBase(&this->super_NBTBase);
  (this->super_NBTBase)._vptr_NBTBase = (_func_int **)&PTR_read_0012cb58;
  std::__cxx11::string::string((string *)&this->_data);
  setType(this);
  return;
}

Assistant:

NBTTagData() { setType(); }